

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O0

void __thiscall Js::String::Set(String *this,char16 *pszValue)

{
  size_t sVar1;
  NoCheckHeapAllocator *this_00;
  char16_t *pcVar2;
  TrackAllocData local_48;
  size_t local_20;
  size_t size;
  char16 *pszValue_local;
  String *this_local;
  
  size = (size_t)pszValue;
  pszValue_local = (char16 *)this;
  if (this->pszValue != (char16 *)0x0) {
    sVar1 = PAL_wcslen(this->pszValue);
    Memory::DeleteArray<Memory::NoCheckHeapAllocator,char16_t>
              ((AllocatorType *)&Memory::NoCheckHeapAllocator::Instance,sVar1 + 1,this->pszValue);
  }
  if (size == 0) {
    this->pszValue = (char16 *)0x0;
  }
  else {
    local_20 = PAL_wcslen((char16_t *)size);
    local_20 = local_20 + 1;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_48,(type_info *)&char16_t::typeinfo,0,local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.cpp"
               ,0x70);
    this_00 = Memory::NoCheckHeapAllocator::TrackAllocInfo
                        ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,&local_48);
    pcVar2 = Memory::AllocateArray<Memory::NoCheckHeapAllocator,char16_t,false>
                       ((Memory *)this_00,
                        (NoCheckHeapAllocator *)Memory::NoCheckHeapAllocator::Alloc,0,local_20);
    this->pszValue = pcVar2;
    wcscpy_s(this->pszValue,local_20,(WCHAR *)size);
  }
  return;
}

Assistant:

void
    String::Set(__in_z_opt const char16* pszValue)
    {
        if(NULL != this->pszValue)
        {
            NoCheckHeapDeleteArray(wcslen(this->pszValue) + 1, this->pszValue);
        }

        if(NULL != pszValue)
        {
            size_t size    = 1 + wcslen(pszValue);
            this->pszValue  = NoCheckHeapNewArray(char16, size);
            wcscpy_s(this->pszValue, size, pszValue);
        }
        else
        {
            this->pszValue = NULL;
        }
    }